

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O0

string_t duckdb::StringVector::AddString(Vector *vector,string *data)

{
  string_t data_00;
  unsigned_long in;
  string_t *in_RSI;
  anon_union_16_2_67f50693_for_value aVar1;
  undefined4 in_stack_ffffffffffffffd0;
  uint32_t in_stack_ffffffffffffffd4;
  char *in_stack_ffffffffffffffd8;
  
  ::std::__cxx11::string::c_str();
  in = ::std::__cxx11::string::size();
  UnsafeNumericCast<unsigned_int,unsigned_long,void>(in);
  string_t::string_t(in_RSI,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4);
  data_00.value.pointer.ptr = (char *)in_RSI;
  data_00.value._0_8_ = in_stack_ffffffffffffffd8;
  aVar1.pointer =
       (anon_struct_16_3_d7536bce_for_pointer)
       AddString((Vector *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),data_00);
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar1.pointer;
}

Assistant:

string_t StringVector::AddString(Vector &vector, const string &data) {
	return StringVector::AddString(vector, string_t(data.c_str(), UnsafeNumericCast<uint32_t>(data.size())));
}